

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddAddGeneralVectorComposeRecur
                   (DdManager *dd,DdHashTable *table,DdNode *f,DdNode **vectorOn,DdNode **vectorOff,
                   int deepest)

{
  int iVar1;
  DdNode *g;
  DdNode *g_00;
  DdNode *f_00;
  DdNode *g_01;
  DdHalfWord local_74;
  ptrint fanout;
  DdNode *res;
  DdNode *e;
  DdNode *t;
  DdNode *E;
  DdNode *T;
  int deepest_local;
  DdNode **vectorOff_local;
  DdNode **vectorOn_local;
  DdNode *f_local;
  DdHashTable *table_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    local_74 = f->index;
  }
  else {
    local_74 = dd->perm[f->index];
  }
  dd_local = (DdManager *)f;
  if (((int)local_74 <= deepest) &&
     (dd_local = (DdManager *)cuddHashTableLookup1(table,f), dd_local == (DdManager *)0x0)) {
    g = cuddAddGeneralVectorComposeRecur(dd,table,(f->type).kids.T,vectorOn,vectorOff,deepest);
    if (g == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
      g_00 = cuddAddGeneralVectorComposeRecur(dd,table,(f->type).kids.E,vectorOn,vectorOff,deepest);
      if (g_00 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,g);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4) + 1;
        f_00 = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOn[f->index],g);
        if (f_00 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,g);
          Cudd_RecursiveDeref(dd,g_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) + 1;
          g_01 = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOff[f->index],g_00);
          if (g_01 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,g);
            Cudd_RecursiveDeref(dd,g_00);
            Cudd_RecursiveDeref(dd,f_00);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4) + 1;
            dd_local = (DdManager *)cuddAddApplyRecur(dd,Cudd_addPlus,f_00,g_01);
            if (dd_local == (DdManager *)0x0) {
              Cudd_RecursiveDeref(dd,g);
              Cudd_RecursiveDeref(dd,g_00);
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,g_01);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(dd,g);
              Cudd_RecursiveDeref(dd,g_00);
              Cudd_RecursiveDeref(dd,f_00);
              Cudd_RecursiveDeref(dd,g_01);
              if ((f->ref == 1) ||
                 (iVar1 = cuddHashTableInsert1(table,f,(DdNode *)dd_local,(ulong)f->ref - 1),
                 iVar1 != 0)) {
                *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
              }
              else {
                Cudd_RecursiveDeref(dd,(DdNode *)dd_local);
                dd_local = (DdManager *)0x0;
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddAddGeneralVectorComposeRecur(
  DdManager * dd /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * f /* ADD in which to compose */,
  DdNode ** vectorOn /* functions to substitute for x_i */,
  DdNode ** vectorOff /* functions to substitute for x_i' */,
  int  deepest /* depth of deepest substitution */)
{
    DdNode      *T,*E,*t,*e;
    DdNode      *res;

    /* If we are past the deepest substitution, return f. */
    if (cuddI(dd,f->index) > deepest) {
        return(f);
    }

    if ((res = cuddHashTableLookup1(table,f)) != NULL) {
#ifdef DD_DEBUG
        addGeneralVectorComposeHits++;
#endif
        return(res);
    }

    /* Split and recur on children of this node. */
    T = cuddAddGeneralVectorComposeRecur(dd,table,cuddT(f),
                                         vectorOn,vectorOff,deepest);
    if (T == NULL)  return(NULL);
    cuddRef(T);
    E = cuddAddGeneralVectorComposeRecur(dd,table,cuddE(f),
                                         vectorOn,vectorOff,deepest);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* Retrieve the compose ADDs for the current top variable and call
    ** cuddAddApplyRecur with the T and E we just created.
    */
    t = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOn[f->index],T);
    if (t == NULL) {
      Cudd_RecursiveDeref(dd,T);
      Cudd_RecursiveDeref(dd,E);
      return(NULL);
    }
    cuddRef(t);
    e = cuddAddApplyRecur(dd,Cudd_addTimes,vectorOff[f->index],E);
    if (e == NULL) {
      Cudd_RecursiveDeref(dd,T);
      Cudd_RecursiveDeref(dd,E);
      Cudd_RecursiveDeref(dd,t);
      return(NULL);
    }
    cuddRef(e);
    res = cuddAddApplyRecur(dd,Cudd_addPlus,t,e);
    if (res == NULL) {
      Cudd_RecursiveDeref(dd,T);
      Cudd_RecursiveDeref(dd,E);
      Cudd_RecursiveDeref(dd,t);
      Cudd_RecursiveDeref(dd,e);
      return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,T);
    Cudd_RecursiveDeref(dd,E);
    Cudd_RecursiveDeref(dd,t);
    Cudd_RecursiveDeref(dd,e);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again
    */
    if (f->ref != 1) {
        ptrint fanout = (ptrint) f->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,f,res,fanout)) {
            Cudd_RecursiveDeref(dd, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(res);

}